

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  BVH *bvh;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  char cVar38;
  byte bVar39;
  bool bVar40;
  AABBNodeMB4D *node1;
  undefined4 uVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar45;
  NodeRef root;
  size_t sVar46;
  byte bVar47;
  uint uVar48;
  NodeRef *pNVar49;
  byte bVar50;
  byte bVar51;
  ulong uVar52;
  ulong uVar53;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 bi_13;
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  vint4 ai_2;
  undefined1 auVar81 [16];
  vint4 ai;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 ai_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_ZMM4 [64];
  vint4 ai_3;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar92;
  float fVar93;
  vint4 bi_1;
  float fVar94;
  undefined1 auVar91 [16];
  vint4 bi_3;
  undefined1 auVar95 [16];
  vfloat4 a0;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar54;
  int iVar55;
  int iVar76;
  int iVar77;
  int iVar78;
  
  bvh = (BVH *)This->ptr;
  sVar46 = (bvh->root).ptr;
  if (sVar46 != 8) {
    auVar63 = *(undefined1 (*) [16])(ray + 0x80);
    auVar58 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar32 = ZEXT812(0) << 0x20;
    auVar59 = ZEXT816(0) << 0x40;
    uVar12 = vcmpps_avx512vl(auVar63,auVar59,5);
    uVar52 = vpcmpeqd_avx512vl(auVar58,(undefined1  [16])valid_i->field_0);
    uVar52 = ((byte)uVar12 & 0xf) & uVar52;
    bVar50 = (byte)uVar52;
    if (bVar50 != 0) {
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      fVar5 = tray.dir.field_0._32_4_;
      auVar56._0_4_ = fVar5 * fVar5;
      fVar6 = tray.dir.field_0._36_4_;
      auVar56._4_4_ = fVar6 * fVar6;
      fVar7 = tray.dir.field_0._40_4_;
      auVar56._8_4_ = fVar7 * fVar7;
      fVar8 = tray.dir.field_0._44_4_;
      auVar56._12_4_ = fVar8 * fVar8;
      auVar57 = vfmadd231ps_fma(auVar56,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vfmadd231ps_fma(auVar57,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar56 = vrsqrt14ps_avx512vl(auVar57);
      auVar62._8_4_ = 0xbf000000;
      auVar62._0_8_ = 0xbf000000bf000000;
      auVar62._12_4_ = 0xbf000000;
      auVar57 = vmulps_avx512vl(auVar57,auVar62);
      fVar90 = auVar56._0_4_;
      fVar92 = auVar56._4_4_;
      fVar93 = auVar56._8_4_;
      fVar94 = auVar56._12_4_;
      auVar68._0_4_ = fVar90 * fVar90 * fVar90 * auVar57._0_4_;
      auVar68._4_4_ = fVar92 * fVar92 * fVar92 * auVar57._4_4_;
      auVar68._8_4_ = fVar93 * fVar93 * fVar93 * auVar57._8_4_;
      auVar68._12_4_ = fVar94 * fVar94 * fVar94 * auVar57._12_4_;
      auVar57._8_4_ = 0x3fc00000;
      auVar57._0_8_ = 0x3fc000003fc00000;
      auVar57._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar68,auVar56,auVar57);
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      uVar43 = uVar52;
      do {
        lVar44 = 0;
        for (uVar53 = uVar43; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
          lVar44 = lVar44 + 1;
        }
        uVar53 = (ulong)(uint)((int)lVar44 * 4);
        auVar57 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar53 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar53 + 0x50)),0x1c);
        fVar90 = *(float *)((long)pre.ray_space + (uVar53 - 0x10));
        auVar57 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(ray + uVar53 + 0x60)),0x28);
        auVar66._0_4_ = auVar57._0_4_ * fVar90;
        auVar66._4_4_ = auVar57._4_4_ * fVar90;
        auVar66._8_4_ = auVar57._8_4_ * fVar90;
        auVar66._12_4_ = auVar57._12_4_ * fVar90;
        auVar62 = vshufpd_avx(auVar66,auVar66,1);
        auVar57 = vmovshdup_avx(auVar66);
        auVar74._0_4_ = auVar57._0_4_ ^ 0x80000000;
        auVar68 = vunpckhps_avx(auVar66,auVar59);
        auVar69._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
        auVar69._8_8_ = auVar62._8_8_ ^ auVar64._8_8_;
        auVar56 = vinsertps_avx(auVar69,auVar66,0x2a);
        auVar57 = vdpps_avx(auVar56,auVar56,0x7f);
        auVar74._4_12_ = auVar32;
        auVar68 = vshufps_avx(auVar68,auVar74,0x41);
        auVar62 = vdpps_avx(auVar68,auVar68,0x7f);
        uVar12 = vcmpps_avx512vl(auVar57,auVar62,1);
        auVar57 = vpmovm2d_avx512vl(uVar12);
        auVar99._0_4_ = auVar57._0_4_;
        auVar99._4_4_ = auVar99._0_4_;
        auVar99._8_4_ = auVar99._0_4_;
        auVar99._12_4_ = auVar99._0_4_;
        uVar53 = vpmovd2m_avx512vl(auVar99);
        auVar65._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * auVar58._4_4_;
        auVar65._0_4_ = (uint)((byte)uVar53 & 1) * auVar58._0_4_;
        auVar65._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * auVar58._8_4_;
        auVar65._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * auVar58._12_4_;
        auVar57 = vblendvps_avx(auVar56,auVar68,auVar65);
        auVar62 = vdpps_avx(auVar57,auVar57,0x7f);
        auVar100._4_12_ = auVar32;
        auVar100._0_4_ = auVar62._0_4_;
        auVar56 = vrsqrt14ss_avx512f(auVar59,auVar100);
        fVar92 = auVar56._0_4_;
        fVar92 = fVar92 * 1.5 - auVar62._0_4_ * 0.5 * fVar92 * fVar92 * fVar92;
        auVar73._0_4_ = auVar57._0_4_ * fVar92;
        auVar73._4_4_ = auVar57._4_4_ * fVar92;
        auVar73._8_4_ = auVar57._8_4_ * fVar92;
        auVar73._12_4_ = auVar57._12_4_ * fVar92;
        auVar57 = vshufps_avx(auVar73,auVar73,0xc9);
        auVar62 = vshufps_avx(auVar66,auVar66,0xc9);
        auVar101._0_4_ = auVar73._0_4_ * auVar62._0_4_;
        auVar101._4_4_ = auVar73._4_4_ * auVar62._4_4_;
        auVar101._8_4_ = auVar73._8_4_ * auVar62._8_4_;
        auVar101._12_4_ = auVar73._12_4_ * auVar62._12_4_;
        auVar57 = vfmsub231ps_fma(auVar101,auVar66,auVar57);
        auVar62 = vshufps_avx(auVar57,auVar57,0xc9);
        auVar57 = vdpps_avx(auVar62,auVar62,0x7f);
        uVar43 = uVar43 - 1 & uVar43;
        auVar102._4_12_ = auVar32;
        auVar102._0_4_ = auVar57._0_4_;
        auVar56 = vrsqrt14ss_avx512f(auVar59,auVar102);
        fVar92 = auVar56._0_4_;
        fVar92 = fVar92 * 1.5 - auVar57._0_4_ * 0.5 * fVar92 * fVar92 * fVar92;
        auVar75._0_4_ = fVar92 * auVar62._0_4_;
        auVar75._4_4_ = fVar92 * auVar62._4_4_;
        auVar75._8_4_ = fVar92 * auVar62._8_4_;
        auVar75._12_4_ = fVar92 * auVar62._12_4_;
        auVar67._0_4_ = fVar90 * auVar66._0_4_;
        auVar67._4_4_ = fVar90 * auVar66._4_4_;
        auVar67._8_4_ = fVar90 * auVar66._8_4_;
        auVar67._12_4_ = fVar90 * auVar66._12_4_;
        auVar56 = vunpcklps_avx(auVar73,auVar67);
        auVar57 = vunpckhps_avx(auVar73,auVar67);
        auVar68 = vunpcklps_avx(auVar75,auVar59);
        auVar62 = vunpckhps_avx(auVar75,auVar59);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar57,auVar62);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar56,auVar68);
        aVar9 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar56,auVar68);
        pre.ray_space[lVar44].vx.field_0 = aVar11;
        pre.ray_space[lVar44].vy.field_0 = aVar9;
        pre.ray_space[lVar44].vz.field_0 = aVar10;
      } while (uVar43 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar103 = ZEXT1664(auVar58);
      auVar59 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar104 = ZEXT1664(auVar59);
      auVar57 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar58);
      uVar43 = vcmpps_avx512vl(auVar57,auVar59,1);
      bVar40 = (bool)((byte)uVar43 & 1);
      iVar54 = auVar59._0_4_;
      auVar60._0_4_ = (uint)bVar40 * iVar54 | (uint)!bVar40 * tray.dir.field_0._0_4_;
      bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
      iVar55 = auVar59._4_4_;
      auVar60._4_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * tray.dir.field_0._4_4_;
      bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
      iVar76 = auVar59._8_4_;
      iVar77 = auVar59._12_4_;
      auVar60._8_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * tray.dir.field_0._8_4_;
      bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar40 * iVar77 | (uint)!bVar40 * tray.dir.field_0._12_4_;
      auVar57 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar58);
      uVar43 = vcmpps_avx512vl(auVar57,auVar59,1);
      bVar40 = (bool)((byte)uVar43 & 1);
      auVar61._0_4_ = (uint)bVar40 * iVar54 | (uint)!bVar40 * tray.dir.field_0._16_4_;
      bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
      auVar61._4_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * tray.dir.field_0._20_4_;
      bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
      auVar61._8_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * tray.dir.field_0._24_4_;
      bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
      auVar61._12_4_ = (uint)bVar40 * iVar77 | (uint)!bVar40 * tray.dir.field_0._28_4_;
      auVar58 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar58);
      uVar43 = vcmpps_avx512vl(auVar58,auVar59,1);
      bVar40 = (bool)((byte)uVar43 & 1);
      auVar58._0_4_ = (uint)bVar40 * iVar54 | (uint)!bVar40 * (int)fVar5;
      bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * (int)fVar6;
      bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * (int)fVar7;
      bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar40 * iVar77 | (uint)!bVar40 * (int)fVar8;
      auVar59 = vrcp14ps_avx512vl(auVar60);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar105 = ZEXT1664(auVar57);
      auVar62 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar106 = ZEXT1664(auVar62);
      auVar56 = vfnmadd213ps_avx512vl(auVar60,auVar59,auVar57);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar56,auVar59,auVar59)
      ;
      auVar59 = vrcp14ps_avx512vl(auVar61);
      auVar56 = vfnmadd213ps_avx512vl(auVar61,auVar59,auVar57);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar56,auVar59,auVar59)
      ;
      auVar59 = vrcp14ps_avx512vl(auVar58);
      auVar58 = vfnmadd213ps_avx512vl(auVar58,auVar59,auVar57);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar58,auVar59,auVar59)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar43 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar62,1);
      auVar58 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar43 >> 1) & 1) * auVar58._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar43 & 1) * auVar58._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar43 >> 2) & 1) * auVar58._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar43 >> 3) & 1) * auVar58._12_4_;
      uVar43 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar62,5);
      auVar58 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar40 = (bool)((byte)uVar43 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar40 * auVar58._0_4_ | (uint)!bVar40 * 0x60;
      bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar40 * auVar58._4_4_ | (uint)!bVar40 * 0x60;
      bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar40 * auVar58._8_4_ | (uint)!bVar40 * 0x60;
      bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar40 * auVar58._12_4_ | (uint)!bVar40 * 0x60;
      uVar43 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar62,5);
      auVar58 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar40 = (bool)((byte)uVar43 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar40 * auVar58._0_4_ | (uint)!bVar40 * 0xa0;
      bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar40 * auVar58._4_4_ | (uint)!bVar40 * 0xa0;
      bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar40 * auVar58._8_4_ | (uint)!bVar40 * 0xa0;
      bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar40 * auVar58._12_4_ | (uint)!bVar40 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar107 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar58 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar62);
      tray.tnear.field_0.i[0] =
           (uint)(bVar50 & 1) * auVar58._0_4_ |
           (uint)!(bool)(bVar50 & 1) * stack_near[0].field_0._0_4_;
      bVar40 = (bool)((byte)(uVar52 >> 1) & 1);
      tray.tnear.field_0.i[1] =
           (uint)bVar40 * auVar58._4_4_ | (uint)!bVar40 * stack_near[0].field_0._4_4_;
      bVar40 = (bool)((byte)(uVar52 >> 2) & 1);
      tray.tnear.field_0.i[2] =
           (uint)bVar40 * auVar58._8_4_ | (uint)!bVar40 * stack_near[0].field_0._8_4_;
      bVar40 = SUB81(uVar52 >> 3,0);
      tray.tnear.field_0.i[3] =
           (uint)bVar40 * auVar58._12_4_ | (uint)!bVar40 * stack_near[0].field_0._12_4_;
      auVar63 = vmaxps_avx512vl(auVar63,auVar62);
      tray.tfar.field_0.i[0] =
           (uint)(bVar50 & 1) * auVar63._0_4_ | (uint)!(bool)(bVar50 & 1) * -0x800000;
      bVar40 = (bool)((byte)(uVar52 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar40 * auVar63._4_4_ | (uint)!bVar40 * -0x800000;
      bVar40 = (bool)((byte)(uVar52 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar40 * auVar63._8_4_ | (uint)!bVar40 * -0x800000;
      bVar40 = SUB81(uVar52 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar40 * auVar63._12_4_ | (uint)!bVar40 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar48 = 3;
      }
      else {
        uVar48 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      bVar47 = (byte)((ushort)((short)uVar52 << 0xc) >> 0xc) ^ 0xf;
      pNVar49 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar45 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar46;
      stack_near[1].field_0.i[0] = tray.tnear.field_0.v[0];
      stack_near[1].field_0.i[1] = tray.tnear.field_0.v[1];
      stack_near[1].field_0.i[2] = tray.tnear.field_0.v[2];
      stack_near[1].field_0.i[3] = tray.tnear.field_0.v[3];
LAB_007719a8:
      do {
        do {
          root.ptr = pNVar49[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00772069;
          pNVar49 = pNVar49 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar45[-1].v;
          auVar80 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar45 = paVar45 + -1;
          uVar52 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar52 == '\0');
        uVar41 = (undefined4)uVar52;
        if (uVar48 < (uint)POPCOUNT(uVar41)) {
LAB_007719e4:
          do {
            iVar54 = 4;
            auVar63 = auVar106._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00772069;
              uVar12 = vcmpps_avx512vl(auVar80._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar12 != '\0') {
                if ((bVar47 & 0xf) == 0xf) {
                  bVar39 = 0;
                }
                else {
                  uVar52 = (ulong)(bVar47 & 0xf ^ 0xf);
                  bVar51 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar2 = This->leafIntersector;
                  bVar39 = 0;
                  do {
                    lVar44 = 0;
                    for (uVar43 = uVar52; (uVar43 & 1) == 0;
                        uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                      lVar44 = lVar44 + 1;
                    }
                    cVar38 = (**(code **)((long)pvVar2 + (ulong)bVar51 * 0x40 + 0x18))
                                       (&pre,ray,lVar44,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    auVar63 = auVar106._0_16_;
                    bVar31 = (byte)(1 << ((uint)lVar44 & 0x1f));
                    if (cVar38 == '\0') {
                      bVar31 = 0;
                    }
                    bVar39 = bVar39 | bVar31;
                    uVar52 = uVar52 - 1 & uVar52;
                  } while (uVar52 != 0);
                }
                bVar47 = bVar47 | bVar39;
                if (bVar47 == 0xf) {
                  bVar47 = 0xf;
                  goto LAB_00772069;
                }
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar40 = (bool)(bVar47 >> 1 & 1);
                bVar3 = (bool)(bVar47 >> 2 & 1);
                bVar4 = (bool)(bVar47 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar40 * auVar58._4_4_ | (uint)!bVar40 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar47 & 1) * auVar58._0_4_ |
                     (uint)!(bool)(bVar47 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar3 * auVar58._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar4 * auVar58._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar103 = ZEXT1664(auVar58);
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar104 = ZEXT1664(auVar58);
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar105 = ZEXT1664(auVar58);
                auVar63 = vxorps_avx512vl(auVar63,auVar63);
                auVar106 = ZEXT1664(auVar63);
                auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar107 = ZEXT1664(auVar63);
              }
              goto LAB_007719a8;
            }
            uVar12 = vcmpps_avx512vl(auVar80._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar52 = root.ptr & 0xfffffffffffffff0;
            uVar42 = (uint)root.ptr & 7;
            lVar44 = -0x20;
            sVar46 = 8;
            auVar58 = auVar107._0_16_;
            do {
              root.ptr = *(size_t *)(uVar52 + 0x40 + lVar44 * 2);
              if (root.ptr == 8) {
                auVar80 = ZEXT1664(auVar58);
                root.ptr = sVar46;
                break;
              }
              if ((uVar42 == 6) || (uVar42 == 1)) {
                uVar41 = *(undefined4 *)(uVar52 + 0x120 + lVar44);
                auVar82._4_4_ = uVar41;
                auVar82._0_4_ = uVar41;
                auVar82._8_4_ = uVar41;
                auVar82._12_4_ = uVar41;
                auVar59 = *(undefined1 (*) [16])(ray + 0x70);
                uVar41 = *(undefined4 *)(uVar52 + 0x60 + lVar44);
                auVar15._4_4_ = uVar41;
                auVar15._0_4_ = uVar41;
                auVar15._8_4_ = uVar41;
                auVar15._12_4_ = uVar41;
                auVar57 = vfmadd213ps_avx512vl(auVar82,auVar59,auVar15);
                uVar41 = *(undefined4 *)(uVar52 + 0x160 + lVar44);
                auVar84._4_4_ = uVar41;
                auVar84._0_4_ = uVar41;
                auVar84._8_4_ = uVar41;
                auVar84._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0xa0 + lVar44);
                auVar16._4_4_ = uVar41;
                auVar16._0_4_ = uVar41;
                auVar16._8_4_ = uVar41;
                auVar16._12_4_ = uVar41;
                auVar62 = vfmadd213ps_avx512vl(auVar84,auVar59,auVar16);
                uVar41 = *(undefined4 *)(uVar52 + 0x1a0 + lVar44);
                auVar86._4_4_ = uVar41;
                auVar86._0_4_ = uVar41;
                auVar86._8_4_ = uVar41;
                auVar86._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0xe0 + lVar44);
                auVar17._4_4_ = uVar41;
                auVar17._0_4_ = uVar41;
                auVar17._8_4_ = uVar41;
                auVar17._12_4_ = uVar41;
                auVar64 = vfmadd213ps_avx512vl(auVar86,auVar59,auVar17);
                uVar41 = *(undefined4 *)(uVar52 + 0x140 + lVar44);
                auVar88._4_4_ = uVar41;
                auVar88._0_4_ = uVar41;
                auVar88._8_4_ = uVar41;
                auVar88._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0x80 + lVar44);
                auVar18._4_4_ = uVar41;
                auVar18._0_4_ = uVar41;
                auVar18._8_4_ = uVar41;
                auVar18._12_4_ = uVar41;
                auVar65 = vfmadd213ps_avx512vl(auVar88,auVar59,auVar18);
                uVar41 = *(undefined4 *)(uVar52 + 0x180 + lVar44);
                auVar91._4_4_ = uVar41;
                auVar91._0_4_ = uVar41;
                auVar91._8_4_ = uVar41;
                auVar91._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0xc0 + lVar44);
                auVar19._4_4_ = uVar41;
                auVar19._0_4_ = uVar41;
                auVar19._8_4_ = uVar41;
                auVar19._12_4_ = uVar41;
                auVar66 = vfmadd213ps_avx512vl(auVar91,auVar59,auVar19);
                uVar41 = *(undefined4 *)(uVar52 + 0x1c0 + lVar44);
                auVar95._4_4_ = uVar41;
                auVar95._0_4_ = uVar41;
                auVar95._8_4_ = uVar41;
                auVar95._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0x100 + lVar44);
                auVar20._4_4_ = uVar41;
                auVar20._0_4_ = uVar41;
                auVar20._8_4_ = uVar41;
                auVar20._12_4_ = uVar41;
                auVar67 = vfmadd213ps_avx512vl(auVar95,auVar59,auVar20);
                auVar56 = vfmsub213ps_fma(auVar57,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0)
                ;
                auVar68 = vfmsub213ps_fma(auVar62,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0)
                ;
                auVar64 = vfmsub213ps_fma(auVar64,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0)
                ;
                auVar65 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0)
                ;
                auVar66 = vfmsub213ps_fma(auVar66,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0)
                ;
                auVar67 = vfmsub213ps_fma(auVar67,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0)
                ;
                auVar57 = vpminsd_avx(auVar56,auVar65);
                auVar62 = vpminsd_avx(auVar68,auVar66);
                auVar57 = vpmaxsd_avx(auVar57,auVar62);
                auVar62 = vpminsd_avx(auVar64,auVar67);
                auVar57 = vpmaxsd_avx(auVar57,auVar62);
                auVar62 = vpmaxsd_avx(auVar56,auVar65);
                auVar56 = vpmaxsd_avx(auVar68,auVar66);
                auVar56 = vpminsd_avx(auVar62,auVar56);
                auVar62 = vpmaxsd_avx(auVar64,auVar67);
                auVar56 = vpminsd_avx(auVar56,auVar62);
                auVar36._4_4_ = tray.tnear.field_0.i[1];
                auVar36._0_4_ = tray.tnear.field_0.i[0];
                auVar36._8_4_ = tray.tnear.field_0.i[2];
                auVar36._12_4_ = tray.tnear.field_0.i[3];
                auVar62 = vpmaxsd_avx(auVar57,auVar36);
                auVar56 = vpminsd_avx(auVar56,(undefined1  [16])tray.tfar.field_0);
                uVar13 = vcmpps_avx512vl(auVar62,auVar56,2);
                bVar51 = (byte)uVar13;
                if (uVar42 == 6) {
                  uVar41 = *(undefined4 *)(uVar52 + 0x200 + lVar44);
                  auVar21._4_4_ = uVar41;
                  auVar21._0_4_ = uVar41;
                  auVar21._8_4_ = uVar41;
                  auVar21._12_4_ = uVar41;
                  uVar13 = vcmpps_avx512vl(auVar59,auVar21,1);
                  uVar41 = *(undefined4 *)(uVar52 + 0x1e0 + lVar44);
                  auVar22._4_4_ = uVar41;
                  auVar22._0_4_ = uVar41;
                  auVar22._8_4_ = uVar41;
                  auVar22._12_4_ = uVar41;
                  uVar14 = vcmpps_avx512vl(auVar59,auVar22,0xd);
                  bVar51 = (byte)uVar13 & (byte)uVar14 & bVar51;
                }
              }
              else {
                uVar41 = *(undefined4 *)(uVar52 + 0x60 + lVar44);
                auVar89._4_4_ = uVar41;
                auVar89._0_4_ = uVar41;
                auVar89._8_4_ = uVar41;
                auVar89._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0x80 + lVar44);
                auVar87._4_4_ = uVar41;
                auVar87._0_4_ = uVar41;
                auVar87._8_4_ = uVar41;
                auVar87._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0xa0 + lVar44);
                auVar85._4_4_ = uVar41;
                auVar85._0_4_ = uVar41;
                auVar85._8_4_ = uVar41;
                auVar85._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0xc0 + lVar44);
                auVar98._4_4_ = uVar41;
                auVar98._0_4_ = uVar41;
                auVar98._8_4_ = uVar41;
                auVar98._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0xe0 + lVar44);
                auVar97._4_4_ = uVar41;
                auVar97._0_4_ = uVar41;
                auVar97._8_4_ = uVar41;
                auVar97._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0x100 + lVar44);
                auVar96._4_4_ = uVar41;
                auVar96._0_4_ = uVar41;
                auVar96._8_4_ = uVar41;
                auVar96._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0x120 + lVar44);
                auVar83._4_4_ = uVar41;
                auVar83._0_4_ = uVar41;
                auVar83._8_4_ = uVar41;
                auVar83._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0x140 + lVar44);
                auVar81._4_4_ = uVar41;
                auVar81._0_4_ = uVar41;
                auVar81._8_4_ = uVar41;
                auVar81._12_4_ = uVar41;
                uVar41 = *(undefined4 *)(uVar52 + 0x160 + lVar44);
                auVar79._4_4_ = uVar41;
                auVar79._0_4_ = uVar41;
                auVar79._8_4_ = uVar41;
                auVar79._12_4_ = uVar41;
                auVar59 = *(undefined1 (*) [16])(ray + 0x70);
                auVar75 = auVar105._0_16_;
                auVar57 = vsubps_avx512vl(auVar75,auVar59);
                uVar41 = *(undefined4 *)(uVar52 + 0x1e0 + lVar44);
                auVar23._4_4_ = uVar41;
                auVar23._0_4_ = uVar41;
                auVar23._8_4_ = uVar41;
                auVar23._12_4_ = uVar41;
                auVar62 = vmulps_avx512vl(auVar59,auVar23);
                uVar41 = *(undefined4 *)(uVar52 + 0x200 + lVar44);
                auVar24._4_4_ = uVar41;
                auVar24._0_4_ = uVar41;
                auVar24._8_4_ = uVar41;
                auVar24._12_4_ = uVar41;
                auVar56 = vmulps_avx512vl(auVar59,auVar24);
                uVar41 = *(undefined4 *)(uVar52 + 0x220 + lVar44);
                auVar25._4_4_ = uVar41;
                auVar25._0_4_ = uVar41;
                auVar25._8_4_ = uVar41;
                auVar25._12_4_ = uVar41;
                auVar68 = vmulps_avx512vl(auVar59,auVar25);
                auVar62 = vfmadd231ps_avx512vl(auVar62,auVar57,auVar63);
                auVar56 = vfmadd231ps_avx512vl(auVar56,auVar57,auVar63);
                uVar41 = *(undefined4 *)(uVar52 + 0x240 + lVar44);
                auVar26._4_4_ = uVar41;
                auVar26._0_4_ = uVar41;
                auVar26._8_4_ = uVar41;
                auVar26._12_4_ = uVar41;
                auVar64 = vmulps_avx512vl(auVar59,auVar26);
                uVar41 = *(undefined4 *)(uVar52 + 0x260 + lVar44);
                auVar27._4_4_ = uVar41;
                auVar27._0_4_ = uVar41;
                auVar27._8_4_ = uVar41;
                auVar27._12_4_ = uVar41;
                auVar65 = vmulps_avx512vl(auVar59,auVar27);
                auVar68 = vfmadd231ps_avx512vl(auVar68,auVar57,auVar63);
                uVar41 = *(undefined4 *)(uVar52 + 0x280 + lVar44);
                auVar28._4_4_ = uVar41;
                auVar28._0_4_ = uVar41;
                auVar28._8_4_ = uVar41;
                auVar28._12_4_ = uVar41;
                auVar59 = vmulps_avx512vl(auVar59,auVar28);
                auVar64 = vaddps_avx512vl(auVar57,auVar64);
                auVar65 = vaddps_avx512vl(auVar57,auVar65);
                auVar57 = vaddps_avx512vl(auVar57,auVar59);
                auVar33._4_4_ = tray.org.field_0._4_4_;
                auVar33._0_4_ = tray.org.field_0._0_4_;
                auVar33._8_4_ = tray.org.field_0._8_4_;
                auVar33._12_4_ = tray.org.field_0._12_4_;
                auVar34._4_4_ = tray.org.field_0._20_4_;
                auVar34._0_4_ = tray.org.field_0._16_4_;
                auVar34._8_4_ = tray.org.field_0._24_4_;
                auVar34._12_4_ = tray.org.field_0._28_4_;
                auVar35._4_4_ = tray.org.field_0._36_4_;
                auVar35._0_4_ = tray.org.field_0._32_4_;
                auVar35._8_4_ = tray.org.field_0._40_4_;
                auVar35._12_4_ = tray.org.field_0._44_4_;
                auVar59 = vmulps_avx512vl(auVar83,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar66 = vmulps_avx512vl(auVar81,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar67 = vmulps_avx512vl(auVar79,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar59 = vfmadd231ps_avx512vl
                                    (auVar59,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar98);
                auVar66 = vfmadd231ps_avx512vl
                                    (auVar66,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar97);
                auVar67 = vfmadd231ps_avx512vl
                                    (auVar67,auVar96,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar59 = vfmadd231ps_avx512vl
                                    (auVar59,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar89);
                auVar66 = vfmadd231ps_avx512vl
                                    (auVar66,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar87);
                auVar67 = vfmadd231ps_avx512vl
                                    (auVar67,auVar85,
                                     (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar73 = auVar103._0_16_;
                auVar69 = vandps_avx512vl(auVar59,auVar73);
                auVar74 = auVar104._0_16_;
                uVar43 = vcmpps_avx512vl(auVar69,auVar74,1);
                bVar40 = (bool)((byte)uVar43 & 1);
                iVar55 = auVar104._0_4_;
                auVar70._0_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * auVar59._0_4_;
                bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
                iVar76 = auVar104._4_4_;
                auVar70._4_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * auVar59._4_4_;
                bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
                iVar77 = auVar104._8_4_;
                iVar78 = auVar104._12_4_;
                auVar70._8_4_ = (uint)bVar40 * iVar77 | (uint)!bVar40 * auVar59._8_4_;
                bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar70._12_4_ = (uint)bVar40 * iVar78 | (uint)!bVar40 * auVar59._12_4_;
                auVar59 = vandps_avx512vl(auVar66,auVar73);
                uVar43 = vcmpps_avx512vl(auVar59,auVar74,1);
                bVar40 = (bool)((byte)uVar43 & 1);
                auVar71._0_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * auVar66._0_4_;
                bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar71._4_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * auVar66._4_4_;
                bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar71._8_4_ = (uint)bVar40 * iVar77 | (uint)!bVar40 * auVar66._8_4_;
                bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar71._12_4_ = (uint)bVar40 * iVar78 | (uint)!bVar40 * auVar66._12_4_;
                auVar59 = vandps_avx512vl(auVar67,auVar73);
                uVar43 = vcmpps_avx512vl(auVar59,auVar74,1);
                bVar40 = (bool)((byte)uVar43 & 1);
                auVar72._0_4_ = (uint)bVar40 * iVar55 | (uint)!bVar40 * auVar67._0_4_;
                bVar40 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar72._4_4_ = (uint)bVar40 * iVar76 | (uint)!bVar40 * auVar67._4_4_;
                bVar40 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar72._8_4_ = (uint)bVar40 * iVar77 | (uint)!bVar40 * auVar67._8_4_;
                bVar40 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar72._12_4_ = (uint)bVar40 * iVar78 | (uint)!bVar40 * auVar67._12_4_;
                auVar59 = vrcp14ps_avx512vl(auVar70);
                auVar66 = vfnmadd213ps_avx512vl(auVar70,auVar59,auVar75);
                auVar66 = vfmadd132ps_avx512vl(auVar66,auVar59,auVar59);
                auVar59 = vrcp14ps_avx512vl(auVar71);
                auVar67 = vfnmadd213ps_avx512vl(auVar71,auVar59,auVar75);
                auVar67 = vfmadd132ps_avx512vl(auVar67,auVar59,auVar59);
                auVar69 = vrcp14ps_avx512vl(auVar72);
                auVar73 = vfnmadd213ps_avx512vl(auVar72,auVar69,auVar75);
                uVar41 = *(undefined4 *)(uVar52 + 0x180 + lVar44);
                auVar59._4_4_ = uVar41;
                auVar59._0_4_ = uVar41;
                auVar59._8_4_ = uVar41;
                auVar59._12_4_ = uVar41;
                auVar59 = vfmadd213ps_avx512vl(auVar83,auVar35,auVar59);
                uVar41 = *(undefined4 *)(uVar52 + 0x1a0 + lVar44);
                auVar29._4_4_ = uVar41;
                auVar29._0_4_ = uVar41;
                auVar29._8_4_ = uVar41;
                auVar29._12_4_ = uVar41;
                auVar74 = vfmadd213ps_avx512vl(auVar81,auVar35,auVar29);
                auVar69 = vfmadd132ps_avx512vl(auVar73,auVar69,auVar69);
                uVar41 = *(undefined4 *)(uVar52 + 0x1c0 + lVar44);
                auVar30._4_4_ = uVar41;
                auVar30._0_4_ = uVar41;
                auVar30._8_4_ = uVar41;
                auVar30._12_4_ = uVar41;
                auVar73 = vfmadd213ps_avx512vl(auVar79,auVar35,auVar30);
                auVar59 = vfmadd231ps_avx512vl(auVar59,auVar34,auVar98);
                auVar74 = vfmadd231ps_avx512vl(auVar74,auVar34,auVar97);
                auVar73 = vfmadd231ps_avx512vl(auVar73,auVar34,auVar96);
                auVar75 = vfmadd231ps_avx512vl(auVar59,auVar33,auVar89);
                auVar74 = vfmadd231ps_avx512vl(auVar74,auVar33,auVar87);
                auVar73 = vfmadd231ps_avx512vl(auVar73,auVar33,auVar85);
                auVar59 = vsubps_avx(auVar62,auVar75);
                auVar62 = vmulps_avx512vl(auVar66,auVar59);
                auVar59 = vsubps_avx(auVar56,auVar74);
                auVar56 = vmulps_avx512vl(auVar67,auVar59);
                auVar59 = vsubps_avx(auVar68,auVar73);
                auVar68 = vmulps_avx512vl(auVar69,auVar59);
                auVar59 = vsubps_avx(auVar64,auVar75);
                auVar64 = vmulps_avx512vl(auVar66,auVar59);
                auVar59 = vsubps_avx(auVar65,auVar74);
                auVar65 = vmulps_avx512vl(auVar67,auVar59);
                auVar59 = vsubps_avx(auVar57,auVar73);
                auVar66 = vmulps_avx512vl(auVar69,auVar59);
                auVar59 = vpminsd_avx(auVar62,auVar64);
                auVar57 = vpminsd_avx(auVar56,auVar65);
                auVar59 = vpmaxsd_avx(auVar59,auVar57);
                auVar57 = vpminsd_avx(auVar68,auVar66);
                auVar57 = vpmaxsd_avx(auVar59,auVar57);
                auVar59 = vpmaxsd_avx(auVar62,auVar64);
                auVar62 = vpmaxsd_avx(auVar56,auVar65);
                auVar62 = vpminsd_avx(auVar59,auVar62);
                auVar59 = vpmaxsd_avx(auVar68,auVar66);
                auVar59 = vpminsd_avx(auVar62,auVar59);
                auVar37._4_4_ = tray.tnear.field_0.i[1];
                auVar37._0_4_ = tray.tnear.field_0.i[0];
                auVar37._8_4_ = tray.tnear.field_0.i[2];
                auVar37._12_4_ = tray.tnear.field_0.i[3];
                auVar62 = vpmaxsd_avx(auVar57,auVar37);
                auVar59 = vpminsd_avx(auVar59,(undefined1  [16])tray.tfar.field_0);
                uVar13 = vcmpps_avx512vl(auVar62,auVar59,2);
                bVar51 = (byte)uVar13;
              }
              bVar51 = bVar51 & (byte)uVar12;
              if (bVar51 == 0) {
                auVar80 = ZEXT1664(auVar58);
                root.ptr = sVar46;
              }
              else {
                auVar57 = vblendmps_avx512vl(auVar107._0_16_,auVar57);
                bVar40 = (bool)(bVar51 >> 1 & 1);
                bVar3 = (bool)(bVar51 >> 2 & 1);
                bVar4 = (bool)(bVar51 >> 3 & 1);
                auVar80 = ZEXT1664(CONCAT412((uint)bVar4 * auVar57._12_4_ |
                                             (uint)!bVar4 * auVar59._12_4_,
                                             CONCAT48((uint)bVar3 * auVar57._8_4_ |
                                                      (uint)!bVar3 * auVar59._8_4_,
                                                      CONCAT44((uint)bVar40 * auVar57._4_4_ |
                                                               (uint)!bVar40 * auVar59._4_4_,
                                                               (uint)(bVar51 & 1) * auVar57._0_4_ |
                                                               (uint)!(bool)(bVar51 & 1) *
                                                               auVar59._0_4_))));
                if (sVar46 != 8) {
                  pNVar49->ptr = sVar46;
                  pNVar49 = pNVar49 + 1;
                  *(undefined1 (*) [16])paVar45->v = auVar58;
                  paVar45 = paVar45 + 1;
                }
              }
              auVar58 = auVar80._0_16_;
              lVar44 = lVar44 + 4;
              sVar46 = root.ptr;
            } while (lVar44 != 0);
            if (root.ptr == 8) goto LAB_00771e40;
            uVar12 = vcmpps_avx512vl((undefined1  [16])auVar80._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar48 < (byte)POPCOUNT((int)uVar12));
          pNVar49->ptr = root.ptr;
          pNVar49 = pNVar49 + 1;
          *paVar45 = auVar80._0_16_;
          paVar45 = paVar45 + 1;
        }
        else {
          do {
            sVar46 = 0;
            for (uVar43 = uVar52; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              sVar46 = sVar46 + 1;
            }
            bVar40 = occluded1(This,bvh,root,sVar46,&pre,ray,&tray,context);
            bVar51 = (byte)(1 << ((uint)sVar46 & 0x1f));
            if (!bVar40) {
              bVar51 = 0;
            }
            bVar47 = bVar47 | bVar51;
            uVar52 = uVar52 - 1 & uVar52;
          } while (uVar52 != 0);
          iVar54 = 3;
          if (bVar47 != 0xf) {
            auVar63 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar40 = (bool)(bVar47 >> 1 & 1);
            bVar3 = (bool)(bVar47 >> 2 & 1);
            bVar4 = (bool)(bVar47 >> 3 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar40 * auVar63._4_4_ | (uint)!bVar40 * tray.tfar.field_0.i[1];
            tray.tfar.field_0.i[0] =
                 (uint)(bVar47 & 1) * auVar63._0_4_ |
                 (uint)!(bool)(bVar47 & 1) * tray.tfar.field_0.i[0];
            tray.tfar.field_0.i[2] =
                 (uint)bVar3 * auVar63._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
            tray.tfar.field_0.i[3] =
                 (uint)bVar4 * auVar63._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
            iVar54 = 2;
          }
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar103 = ZEXT1664(auVar63);
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar104 = ZEXT1664(auVar63);
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar105 = ZEXT1664(auVar63);
          auVar63 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
          auVar106 = ZEXT1664(auVar63);
          auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar107 = ZEXT1664(auVar63);
          auVar80 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (uVar48 < (uint)POPCOUNT(uVar41)) goto LAB_007719e4;
        }
LAB_00771e40:
      } while (iVar54 != 3);
LAB_00772069:
      bVar47 = bVar47 & bVar50;
      bVar40 = (bool)(bVar47 >> 1 & 1);
      bVar3 = (bool)(bVar47 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar47 & 1) * -0x800000 | (uint)!(bool)(bVar47 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar40 * -0x800000 | (uint)!bVar40 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar47 >> 3) * -0x800000 | (uint)!(bool)(bVar47 >> 3) * *(int *)(ray + 0x8c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }